

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallExportGenerator::GenerateScriptConfigs
          (cmInstallExportGenerator *this,ostream *os,Indent indent)

{
  long *plVar1;
  _Rb_tree_header *p_Var2;
  pointer pbVar3;
  pointer pbVar4;
  _Base_ptr p_Var5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  cmExportInstallFileGenerator *pcVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  pointer pbVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  cmInstallExportGenerator *pcVar18;
  Indent indent_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string config_test;
  string config_file_example;
  string toInstallFile;
  string installedFile;
  string installedDir;
  string cxx_module_dest;
  int local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_168;
  cmInstallExportGenerator *local_150;
  undefined1 local_148 [32];
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  _Rb_tree_node_base *local_118;
  ulong local_110;
  string local_108;
  string local_e8;
  string local_c8;
  string local_98;
  string local_78;
  string *local_58;
  string local_50;
  
  cmScriptGenerator::GenerateScriptConfigs((cmScriptGenerator *)this,os,indent);
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar8 = (this->EFGen)._M_t.
           super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
           .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
  p_Var7 = *(_Base_ptr *)((long)&(pcVar8->ConfigImportFiles)._M_t + 0x18);
  p_Var5 = (_Base_ptr)((long)&(pcVar8->ConfigImportFiles)._M_t + 8);
  local_150 = this;
  local_110 = (ulong)(uint)indent.Level;
  if (p_Var7 != p_Var5) {
    local_118 = (_Rb_tree_node_base *)CONCAT44(local_118._4_4_,indent.Level + 2);
    local_58 = &(this->super_cmInstallGenerator).Destination;
    do {
      uVar12 = local_110;
      pcVar18 = local_150;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_168,(value_type *)(p_Var7 + 2));
      cmScriptGenerator::CreateConfigTest
                ((string *)local_148,(cmScriptGenerator *)pcVar18,(string *)(p_Var7 + 1));
      if (0 < (int)uVar12) {
        uVar11 = uVar12 & 0xffffffff;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          uVar9 = (int)uVar11 - 1;
          uVar11 = (ulong)uVar9;
        } while (uVar9 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"if(",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)local_148._0_8_,local_148._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
      cmInstallGenerator::AddInstallRule
                (&pcVar18->super_cmInstallGenerator,os,local_58,cmInstallType_FILES,&local_168,false
                 ,(pcVar18->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,(char *)0x0,
                 local_118._0_4_,(char *)0x0);
      if (0 < (int)uVar12) {
        uVar12 = uVar12 & 0xffffffff;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          uVar9 = (int)uVar12 - 1;
          uVar12 = (ulong)uVar9;
        } while (uVar9 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
      pbVar4 = local_168.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = local_168.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar14 = &(local_168.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar1 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar14 + -1))->_M_dataplus)._M_p;
          if (paVar14 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar1) {
            operator_delete(plVar1,paVar14->_M_allocated_capacity + 1);
          }
          pbVar13 = (pointer)(paVar14 + 1);
          paVar14 = paVar14 + 2;
        } while (pbVar13 != pbVar4);
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
      }
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != p_Var5);
  }
  uVar12 = local_110;
  pcVar18 = local_150;
  local_148._8_8_ = (local_150->super_cmInstallGenerator).Destination._M_dataplus._M_p;
  local_148._0_8_ = (local_150->super_cmInstallGenerator).Destination._M_string_length;
  local_148._24_8_ = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (char *)0x1;
  local_c8.field_2._M_local_buf[0] = '/';
  local_148._16_8_ = 1;
  local_120 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_150->CxxModulesDirectory)._M_dataplus._M_p;
  local_128 = (local_150->CxxModulesDirectory)._M_string_length;
  views._M_len = 3;
  views._M_array = (iterator)local_148;
  local_c8._M_string_length = local_148._24_8_;
  cmCatViews_abi_cxx11_(&local_78,views);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  pcVar8 = (pcVar18->EFGen)._M_t.
           super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
           .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
  if ((*(_Base_ptr *)((long)&(pcVar8->ConfigCxxModuleFiles)._M_t + 0x18) !=
       (_Base_ptr)((long)&(pcVar8->ConfigCxxModuleFiles)._M_t + 8U)) &&
     (std::__cxx11::string::_M_assign((string *)&local_108), local_108._M_string_length != 0)) {
    cmInstallGenerator::ConvertToAbsoluteDestination(&local_e8,&local_78);
    local_148._0_8_ = (pointer)0xd;
    local_148._8_8_ = "$ENV{DESTDIR}";
    local_148._16_8_ = local_e8._M_string_length;
    local_148._24_8_ = local_e8._M_dataplus._M_p;
    local_c8._M_dataplus._M_p = (char *)0x1;
    local_120 = &local_c8.field_2;
    local_c8.field_2._M_local_buf[0] = '/';
    local_128 = 1;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_148;
    local_c8._M_string_length = (size_type)local_120;
    cmCatViews_abi_cxx11_(&local_98,views_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    local_148._0_8_ = local_98._M_string_length;
    local_148._8_8_ = local_98._M_dataplus._M_p;
    local_148._16_8_ = 0x12;
    local_148._24_8_ = "/cxx-modules.cmake";
    views_01._M_len = 2;
    views_01._M_array = (iterator)local_148;
    cmCatViews_abi_cxx11_(&local_c8,views_01);
    cmsys::SystemTools::GetFilenamePath(&local_50,&local_108);
    local_148._0_8_ = local_50._M_string_length;
    local_148._8_8_ = local_50._M_dataplus._M_p;
    local_148._16_8_ = 0x12;
    local_148._24_8_ = "/cxx-modules.cmake";
    views_02._M_len = 2;
    views_02._M_array = (iterator)local_148;
    cmCatViews_abi_cxx11_(&local_e8,views_02);
    uVar12 = local_110;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    indent_00.Level = (int)uVar12;
    if (0 < indent_00.Level) {
      uVar11 = uVar12 & 0xffffffff;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        uVar9 = (int)uVar11 - 1;
        uVar11 = (ulong)uVar9;
      } while (uVar9 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"if(EXISTS \"",0xb);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_c8._M_dataplus._M_p,local_c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
    local_170 = indent_00.Level + 2;
    iVar10 = local_170;
    if (-2 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"file(DIFFERENT _cmake_export_file_changed FILES\n",0x30);
    iVar10 = local_170;
    if (-2 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"     \"",6);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_c8._M_dataplus._M_p,local_c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"\n",2);
    iVar10 = local_170;
    if (-2 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"     \"",6);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,local_e8._M_dataplus._M_p,local_e8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
    iVar10 = local_170;
    if (-2 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"if(_cmake_export_file_changed)\n",0x1f);
    iVar17 = indent_00.Level + 4;
    iVar10 = iVar17;
    if (-4 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"file(GLOB _cmake_old_config_files \"",0x23);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_98._M_dataplus._M_p,local_98._M_string_length);
    cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_
              ((string *)local_148,
               (local_150->EFGen)._M_t.
               super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
               .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,(char *)local_148._0_8_,local_148._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\")\n",3);
    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
    }
    iVar10 = iVar17;
    if (-4 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"if(_cmake_old_config_files)\n",0x1c);
    iVar16 = indent_00.Level + 6;
    iVar10 = iVar16;
    if (-6 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,
               "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n"
               ,0x53);
    iVar10 = iVar16;
    if (-6 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"message(STATUS \"Old C++ module export file \\\"",0x2d);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_c8._M_dataplus._M_p,local_c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,
               "\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n",0x4a
              );
    iVar10 = iVar16;
    if (-6 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"unset(_cmake_old_config_files_text)\n",0x24);
    if (-6 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"file(REMOVE ${_cmake_old_config_files})\n",0x28);
    iVar10 = iVar17;
    if (-4 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
    if (-4 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar17 = iVar17 + -1;
      } while (iVar17 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"unset(_cmake_old_config_files)\n",0x1f);
    iVar10 = local_170;
    if (-2 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
    if (-2 < indent_00.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        local_170 = local_170 + -1;
      } while (local_170 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (os,"unset(_cmake_export_file_changed)\n",0x22);
    if (0 < indent_00.Level) {
      uVar12 = uVar12 & 0xffffffff;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        uVar9 = (int)uVar12 - 1;
        uVar12 = (ulong)uVar9;
      } while (uVar9 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_168,&local_e8);
    cmInstallGenerator::AddInstallRule
              (&local_150->super_cmInstallGenerator,os,&local_78,cmInstallType_FILES,&local_168,
               false,(local_150->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,
               (char *)0x0,indent_00,(char *)0x0);
    pcVar18 = local_150;
    pbVar4 = local_168.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar3 = local_168.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      paVar14 = &(local_168.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->field_2;
      do {
        plVar1 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (paVar14 + -1))->_M_dataplus)._M_p;
        if (paVar14 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar1) {
          operator_delete(plVar1,paVar14->_M_allocated_capacity + 1);
        }
        pbVar13 = (pointer)(paVar14 + 1);
        paVar14 = paVar14 + 2;
      } while (pbVar13 != pbVar4);
      local_168.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    uVar12 = local_110;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,
                      CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                               local_c8.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar8 = (pcVar18->EFGen)._M_t.
           super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
           .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
  p_Var7 = *(_Base_ptr *)((long)&(pcVar8->ConfigCxxModuleFiles)._M_t + 0x18);
  p_Var2 = (_Rb_tree_header *)((long)&(pcVar8->ConfigCxxModuleFiles)._M_t + 8);
  if ((_Rb_tree_header *)p_Var7 != p_Var2) {
    local_118 = (_Rb_tree_node_base *)CONCAT44(local_118._4_4_,(int)uVar12 + 2);
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_168,(value_type *)(p_Var7 + 2));
      cmScriptGenerator::CreateConfigTest
                ((string *)local_148,(cmScriptGenerator *)pcVar18,(string *)(p_Var7 + 1));
      if (0 < (int)uVar12) {
        uVar11 = uVar12 & 0xffffffff;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          uVar9 = (int)uVar11 - 1;
          uVar11 = (ulong)uVar9;
        } while (uVar9 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"if(",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)local_148._0_8_,local_148._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
      cmInstallGenerator::AddInstallRule
                (&pcVar18->super_cmInstallGenerator,os,&local_78,cmInstallType_FILES,&local_168,
                 false,(pcVar18->FilePermissions)._M_dataplus._M_p,(char *)0x0,(char *)0x0,
                 (char *)0x0,local_118._0_4_,(char *)0x0);
      if (0 < (int)uVar12) {
        uVar12 = uVar12 & 0xffffffff;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          uVar9 = (int)uVar12 - 1;
          uVar12 = (ulong)uVar9;
        } while (uVar9 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
      pbVar4 = local_168.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = local_168.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar14 = &(local_168.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar1 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar14 + -1))->_M_dataplus)._M_p;
          if (paVar14 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar1) {
            operator_delete(plVar1,paVar14->_M_allocated_capacity + 1);
          }
          pbVar13 = (pointer)(paVar14 + 1);
          paVar14 = paVar14 + 2;
        } while (pbVar13 != pbVar4);
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
      }
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      pcVar18 = local_150;
      uVar12 = local_110;
    } while ((_Rb_tree_header *)p_Var7 != p_Var2);
    pcVar8 = (local_150->EFGen)._M_t.
             super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
             .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
  }
  p_Var7 = *(_Base_ptr *)((long)&(pcVar8->ConfigCxxModuleTargetFiles)._M_t._M_impl + 0x18);
  p_Var2 = (_Rb_tree_header *)((long)&(pcVar8->ConfigCxxModuleTargetFiles)._M_t._M_impl + 8);
  if ((_Rb_tree_header *)p_Var7 != p_Var2) {
    uVar11 = uVar12;
    local_118 = (_Rb_tree_node_base *)p_Var2;
    do {
      cmScriptGenerator::CreateConfigTest
                ((string *)local_148,(cmScriptGenerator *)pcVar18,(string *)(p_Var7 + 1));
      if (0 < (int)uVar11) {
        uVar15 = uVar11 & 0xffffffff;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          uVar9 = (int)uVar15 - 1;
          uVar15 = (ulong)uVar9;
        } while (uVar9 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"if(",3);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,(char *)local_148._0_8_,local_148._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,")\n",2);
      cmInstallGenerator::AddInstallRule
                (&pcVar18->super_cmInstallGenerator,os,&local_78,cmInstallType_FILES,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(p_Var7 + 2),false,(pcVar18->FilePermissions)._M_dataplus._M_p,(char *)0x0,
                 (char *)0x0,(char *)0x0,(Indent)((int)uVar12 + 2),(char *)0x0);
      if (0 < (int)uVar11) {
        uVar11 = uVar11 & 0xffffffff;
        do {
          std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
          uVar9 = (int)uVar11 - 1;
          uVar11 = (ulong)uVar9;
        } while (uVar9 != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"endif()\n",8);
      pbVar4 = local_168.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar3 = local_168.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_168.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        paVar14 = &(local_168.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->field_2;
        do {
          plVar1 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (paVar14 + -1))->_M_dataplus)._M_p;
          if (paVar14 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar1) {
            operator_delete(plVar1,paVar14->_M_allocated_capacity + 1);
          }
          pbVar13 = (pointer)(paVar14 + 1);
          paVar14 = paVar14 + 2;
        } while (pbVar13 != pbVar4);
        local_168.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar3;
      }
      if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
        operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      pcVar18 = local_150;
      uVar11 = local_110;
    } while (p_Var7 != local_118);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_168);
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScriptConfigs(std::ostream& os,
                                                     Indent indent)
{
  // Create the main install rules first.
  this->cmInstallGenerator::GenerateScriptConfigs(os, indent);

  // Now create a configuration-specific install rule for the import
  // file of each configuration.
  std::vector<std::string> files;
  for (auto const& i : this->EFGen->GetConfigImportFiles()) {
    files.push_back(i.second);
    std::string config_test = this->CreateConfigTest(i.first);
    os << indent << "if(" << config_test << ")\n";
    this->AddInstallRule(os, this->Destination, cmInstallType_FILES, files,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent.Next());
    os << indent << "endif()\n";
    files.clear();
  }

  // Now create a configuration-specific install rule for the C++ module import
  // property file of each configuration.
  auto cxx_module_dest =
    cmStrCat(this->Destination, '/', this->CxxModulesDirectory);
  std::string config_file_example;
  for (auto const& i : this->EFGen->GetConfigCxxModuleFiles()) {
    config_file_example = i.second;
    break;
  }
  if (!config_file_example.empty()) {
    // Remove old per-configuration export files if the main changes.
    std::string installedDir = cmStrCat(
      "$ENV{DESTDIR}", ConvertToAbsoluteDestination(cxx_module_dest), '/');
    std::string installedFile = cmStrCat(installedDir, "/cxx-modules.cmake");
    std::string toInstallFile =
      cmStrCat(cmSystemTools::GetFilenamePath(config_file_example),
               "/cxx-modules.cmake");
    os << indent << "if(EXISTS \"" << installedFile << "\")\n";
    Indent indentN = indent.Next();
    Indent indentNN = indentN.Next();
    Indent indentNNN = indentNN.Next();
    /* clang-format off */
    os << indentN << "file(DIFFERENT _cmake_export_file_changed FILES\n"
       << indentN << "     \"" << installedFile << "\"\n"
       << indentN << "     \"" << toInstallFile << "\")\n";
    os << indentN << "if(_cmake_export_file_changed)\n";
    os << indentNN << "file(GLOB _cmake_old_config_files \"" << installedDir
       << this->EFGen->GetConfigImportFileGlob() << "\")\n";
    os << indentNN << "if(_cmake_old_config_files)\n";
    os << indentNNN << "string(REPLACE \";\" \", \" _cmake_old_config_files_text \"${_cmake_old_config_files}\")\n";
    os << indentNNN << R"(message(STATUS "Old C++ module export file \")" << installedFile
       << "\\\" will be replaced.  Removing files [${_cmake_old_config_files_text}].\")\n";
    os << indentNNN << "unset(_cmake_old_config_files_text)\n";
    os << indentNNN << "file(REMOVE ${_cmake_old_config_files})\n";
    os << indentNN << "endif()\n";
    os << indentNN << "unset(_cmake_old_config_files)\n";
    os << indentN << "endif()\n";
    os << indentN << "unset(_cmake_export_file_changed)\n";
    os << indent << "endif()\n";
    /* clang-format on */

    // All of these files are siblings; get its location to know where the
    // "anchor" file is.
    files.push_back(toInstallFile);
    this->AddInstallRule(os, cxx_module_dest, cmInstallType_FILES, files,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent);
    files.clear();
  }
  for (auto const& i : this->EFGen->GetConfigCxxModuleFiles()) {
    files.push_back(i.second);
    std::string config_test = this->CreateConfigTest(i.first);
    os << indent << "if(" << config_test << ")\n";
    this->AddInstallRule(os, cxx_module_dest, cmInstallType_FILES, files,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent.Next());
    os << indent << "endif()\n";
    files.clear();
  }
  for (auto const& i : this->EFGen->GetConfigCxxModuleTargetFiles()) {
    std::string config_test = this->CreateConfigTest(i.first);
    os << indent << "if(" << config_test << ")\n";
    this->AddInstallRule(os, cxx_module_dest, cmInstallType_FILES, i.second,
                         false, this->FilePermissions.c_str(), nullptr,
                         nullptr, nullptr, indent.Next());
    os << indent << "endif()\n";
    files.clear();
  }
}